

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  size_t __n;
  byte bVar5;
  size_t byte_len;
  size_t unused_bits;
  size_t len;
  int ret;
  size_t bits_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  uVar4 = bits + 7 >> 3;
  bVar5 = (char)uVar4 * '\b' - (char)bits;
  if ((*p < start) || ((ulong)((long)*p - (long)start) < uVar4 + 1)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    if (uVar4 != 0) {
      __n = uVar4 - 1;
      bVar1 = buf[__n];
      puVar2 = *p;
      *p = puVar2 + -1;
      puVar2[-1] = bVar1 & ((char)(1 << (bVar5 & 0x1f)) - 1U ^ 0xff);
      *p = *p + -__n;
      memcpy(*p,buf,__n);
    }
    puVar2 = *p;
    *p = puVar2 + -1;
    puVar2[-1] = bVar5;
    p_local._4_4_ = mbedtls_asn1_write_len(p,start,uVar4 + 1);
    if (-1 < p_local._4_4_) {
      iVar3 = p_local._4_4_ + (int)(uVar4 + 1);
      p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x03');
      if (-1 < p_local._4_4_) {
        p_local._4_4_ = p_local._4_4_ + iVar3;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_bitstring( unsigned char **p, unsigned char *start,
                          const unsigned char *buf, size_t bits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = ( bits + 7 ) / 8;
    unused_bits = ( byte_len * 8 ) - bits;

    if( *p < start || (size_t)( *p - start ) < byte_len + 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if( byte_len > 0 )
    {
        byte_len--;
        *--( *p ) = buf[byte_len] & ~( ( 0x1 << unused_bits ) - 1 );
        ( *p ) -= byte_len;
        memcpy( *p, buf, byte_len );
    }

    /* Write unused bits */
    *--( *p ) = (unsigned char)unused_bits;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    return( (int) len );
}